

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool google::protobuf::compiler::js::anon_unknown_0::HasMap
               (GeneratorOptions *options,Descriptor *desc)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = -1;
  lVar4 = 0;
  do {
    lVar5 = lVar5 + 1;
    if (*(int *)((long)&(options->namespace_prefix)._M_string_length + 4) <= lVar5) {
      lVar5 = -1;
      lVar4 = 0;
      do {
        iVar1._0_1_ = options->add_require_for_enums;
        iVar1._1_1_ = options->testonly;
        iVar1._2_2_ = *(undefined2 *)&options->field_0x4a;
        lVar3 = (long)iVar1;
        lVar5 = lVar5 + 1;
        if (lVar3 <= lVar5) {
          return lVar5 < lVar3;
        }
        bVar2 = HasMap((GeneratorOptions *)((options->library)._M_dataplus._M_p + lVar4),desc);
        lVar4 = lVar4 + 0xa8;
      } while (!bVar2);
      return lVar5 < lVar3;
    }
    bVar2 = FieldDescriptor::is_map
                      ((FieldDescriptor *)
                       (lVar4 + (options->namespace_prefix).field_2._M_allocated_capacity));
    lVar4 = lVar4 + 0xa8;
  } while (!bVar2);
  return true;
}

Assistant:

bool HasMap(const GeneratorOptions& options, const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); i++) {
    if (IsMap(options, desc->field(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasMap(options, desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}